

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<false>_>::assign_operators
          (fm_engine_base<ymfm::opn_registers_base<false>_> *this)

{
  uint32_t uVar1;
  pointer this_00;
  fm_operator<ymfm::opn_registers_base<false>_> *local_48;
  uint local_24;
  uint32_t opnum;
  uint32_t index;
  uint32_t chnum;
  operator_mapping map;
  fm_engine_base<ymfm::opn_registers_base<false>_> *this_local;
  
  map.chan._4_8_ = this;
  opn_registers_base<false>::operator_map(&this->m_regs,(operator_mapping *)&index);
  for (opnum = 0; opnum < 3; opnum = opnum + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      uVar1 = bitfield((&index)[opnum],local_24 << 3,8);
      this_00 = std::
                unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<false>_>_>_>
                ::operator->(this->m_channel + opnum);
      if (uVar1 == 0xff) {
        local_48 = (fm_operator<ymfm::opn_registers_base<false>_> *)0x0;
      }
      else {
        local_48 = std::
                   unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<false>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<false>_>_>_>
                   ::get(this->m_operator + uVar1);
      }
      fm_channel<ymfm::opn_registers_base<false>_>::assign(this_00,local_24,local_48);
    }
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::assign_operators()
{
	typename RegisterType::operator_mapping map;
	m_regs.operator_map(map);

	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		for (uint32_t index = 0; index < 4; index++)
		{
			uint32_t opnum = bitfield(map.chan[chnum], 8 * index, 8);
			m_channel[chnum]->assign(index, (opnum == 0xff) ? nullptr : m_operator[opnum].get());
		}
}